

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void CTcSymLocal::s_gen_code_getlcl(int var_num,int is_param)

{
  int iVar1;
  CTcGenTarg *pCVar2;
  bool bVar3;
  undefined8 in_RCX;
  void *__buf;
  char cVar4;
  uchar opc;
  uint16_t tmp;
  int iVar5;
  char buf [2];
  char local_b;
  undefined2 local_a;
  size_t __n;
  
  cVar4 = (char)var_num;
  if (var_num < 4 && is_param != 0) {
    opc = cVar4 + '|';
  }
  else {
    bVar3 = 5 < var_num || is_param != 0;
    __n = CONCAT71((int7)((ulong)in_RCX >> 8),bVar3);
    if (bVar3) {
      if (var_num < 0x100) {
        CTcGenTarg::write_op(G_cg,(is_param != 0) * '\x02' + 0x80);
        iVar5 = (int)&local_b;
        __buf = (void *)0x1;
        local_b = cVar4;
      }
      else {
        CTcGenTarg::write_op(G_cg,(is_param != 0) * '\x02' + 0x81);
        iVar5 = (int)&local_a;
        local_a = (undefined2)var_num;
        __buf = (void *)0x2;
      }
      CTcDataStream::write(&G_cs->super_CTcDataStream,iVar5,__buf,__n);
      goto LAB_00211b11;
    }
    opc = cVar4 + 0xaa;
  }
  CTcGenTarg::write_op(G_cg,opc);
LAB_00211b11:
  pCVar2 = G_cg;
  iVar1 = G_cg->sp_depth_;
  iVar5 = iVar1 + 1;
  G_cg->sp_depth_ = iVar5;
  if (pCVar2->max_sp_depth_ <= iVar1) {
    pCVar2->max_sp_depth_ = iVar5;
  }
  return;
}

Assistant:

void CTcSymLocal::s_gen_code_getlcl(int var_num, int is_param)
{
    /* use the shortest form of the instruction that we can */
    if (is_param && var_num < 4)
    {
        /* arguments 0-3 have dedicated opcodes */
        G_cg->write_op(OPC_GETARGN0 + var_num);
    }
    else if (!is_param && var_num < 6)
    {
        /* locals 0-5 have dedicated opcodes */
        G_cg->write_op(OPC_GETLCLN0 + var_num);
    }
    else if (var_num <= 255)
    {
        /* 8-bit local number - use the one-byte form */
        G_cg->write_op(is_param ? OPC_GETARG1 : OPC_GETLCL1);
        G_cs->write((char)var_num);
    }
    else
    {
        /* local number won't fit in 8 bits - use the two-byte form */
        G_cg->write_op(is_param ? OPC_GETARG2 : OPC_GETLCL2);
        G_cs->write2(var_num);
    }

    /* note the push */
    G_cg->note_push();
}